

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void disas_crypto_three_reg_sha(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx;
  bool bVar1;
  _Bool _Var2;
  uintptr_t o_3;
  TCGv_ptr pTVar3;
  TCGv_ptr pTVar4;
  TCGv_ptr pTVar5;
  TCGv_i32 pTVar6;
  uint val;
  uintptr_t o_1;
  code *pcVar7;
  uintptr_t o_2;
  uintptr_t o;
  TCGTemp *local_58;
  TCGv_ptr local_50;
  TCGv_ptr local_48;
  TCGTemp *local_40;
  
  if ((insn & 0xc00000) != 0) {
switchD_0063ab24_caseD_7:
    unallocated_encoding_aarch64(s);
    return;
  }
  tcg_ctx = s->uc->tcg_ctx;
  val = insn >> 0xc & 7;
  switch(val) {
  default:
    if ((s->isar->id_aa64isar0 & 0xf00) == 0) goto switchD_0063ab24_caseD_7;
    bVar1 = true;
    pcVar7 = (code *)0x0;
    goto LAB_0063ab76;
  case 4:
    if ((s->isar->id_aa64isar0 & 0xf000) == 0) goto switchD_0063ab24_caseD_7;
    pcVar7 = gen_helper_crypto_sha256h;
    break;
  case 5:
    if ((s->isar->id_aa64isar0 & 0xf000) == 0) goto switchD_0063ab24_caseD_7;
    pcVar7 = gen_helper_crypto_sha256h2;
    break;
  case 6:
    if ((s->isar->id_aa64isar0 & 0xf000) == 0) goto switchD_0063ab24_caseD_7;
    pcVar7 = gen_helper_crypto_sha256su1;
    break;
  case 7:
    goto switchD_0063ab24_caseD_7;
  }
  bVar1 = false;
LAB_0063ab76:
  _Var2 = fp_access_check(s);
  if (_Var2) {
    pTVar3 = vec_full_reg_ptr(s,insn & 0x1f);
    pTVar4 = vec_full_reg_ptr(s,insn >> 5 & 0x1f);
    pTVar5 = vec_full_reg_ptr(s,insn >> 0x10 & 0x1f);
    if (bVar1) {
      pTVar6 = tcg_const_i32_aarch64(tcg_ctx,val);
      local_58 = (TCGTemp *)(pTVar3 + (long)&tcg_ctx->pool_cur);
      local_50 = pTVar4 + (long)&tcg_ctx->pool_cur;
      local_48 = pTVar5 + (long)&tcg_ctx->pool_cur;
      local_40 = (TCGTemp *)(pTVar6 + (long)tcg_ctx);
      tcg_gen_callN_aarch64(tcg_ctx,helper_crypto_sha1_3reg_aarch64,(TCGTemp *)0x0,4,&local_58);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
    }
    else {
      (*pcVar7)(tcg_ctx,pTVar3,pTVar4,pTVar5);
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
  }
  return;
}

Assistant:

static void disas_crypto_three_reg_sha(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int size = extract32(insn, 22, 2);
    int opcode = extract32(insn, 12, 3);
    int rm = extract32(insn, 16, 5);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    CryptoThreeOpFn *genfn;
    TCGv_ptr tcg_rd_ptr, tcg_rn_ptr, tcg_rm_ptr;
    bool feature;

    if (size != 0) {
        unallocated_encoding(s);
        return;
    }

    switch (opcode) {
    case 0: /* SHA1C */
    case 1: /* SHA1P */
    case 2: /* SHA1M */
    case 3: /* SHA1SU0 */
        genfn = NULL;
        feature = dc_isar_feature(aa64_sha1, s);
        break;
    case 4: /* SHA256H */
        genfn = gen_helper_crypto_sha256h;
        feature = dc_isar_feature(aa64_sha256, s);
        break;
    case 5: /* SHA256H2 */
        genfn = gen_helper_crypto_sha256h2;
        feature = dc_isar_feature(aa64_sha256, s);
        break;
    case 6: /* SHA256SU1 */
        genfn = gen_helper_crypto_sha256su1;
        feature = dc_isar_feature(aa64_sha256, s);
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!feature) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_rd_ptr = vec_full_reg_ptr(s, rd);
    tcg_rn_ptr = vec_full_reg_ptr(s, rn);
    tcg_rm_ptr = vec_full_reg_ptr(s, rm);

    if (genfn) {
        genfn(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr, tcg_rm_ptr);
    } else {
        TCGv_i32 tcg_opcode = tcg_const_i32(tcg_ctx, opcode);

        gen_helper_crypto_sha1_3reg(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr,
                                    tcg_rm_ptr, tcg_opcode);
        tcg_temp_free_i32(tcg_ctx, tcg_opcode);
    }

    tcg_temp_free_ptr(tcg_ctx, tcg_rd_ptr);
    tcg_temp_free_ptr(tcg_ctx, tcg_rn_ptr);
    tcg_temp_free_ptr(tcg_ctx, tcg_rm_ptr);
}